

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

char ** SoapySDRDevice_listAntennas
                  (SoapySDRDevice *device,int direction,size_t channel,size_t *length)

{
  undefined1 *puVar1;
  char **ppcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  
  *length = 0;
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0xd8))(&vStack_48,device,direction,channel);
  ppcVar2 = toStrArray(&vStack_48,length,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_48);
  return ppcVar2;
}

Assistant:

char **SoapySDRDevice_listAntennas(const SoapySDRDevice *device, const int direction, const size_t channel, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toStrArray(device->listAntennas(direction, channel), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}